

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.h
# Opt level: O0

void __thiscall
cfd::core::TxOutReference::TxOutReference(TxOutReference *this,TxOutReference *param_1)

{
  TxOutReference *param_1_local;
  TxOutReference *this_local;
  
  AbstractTxOutReference::AbstractTxOutReference
            (&this->super_AbstractTxOutReference,&param_1->super_AbstractTxOutReference);
  (this->super_AbstractTxOutReference)._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__TxOutReference_008963e8;
  return;
}

Assistant:

class CFD_CORE_EXPORT TxOutReference : public AbstractTxOutReference {
 public:
  /**
   * @brief constructor
   * @param[in] tx_out  TxOut instance
   */
  explicit TxOutReference(const TxOut& tx_out);
  /**
   * @brief default constructor.
   */
  TxOutReference() : TxOutReference(TxOut()) {
    // do nothing
  }
  /**
   * @brief destructor
   */
  virtual ~TxOutReference() {
    // do nothing
  }
}